

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender __thiscall
fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,format_specs<char> *specs,
          digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  undefined1 n_00 [16];
  undefined1 value_01 [16];
  undefined1 n_01 [16];
  undefined1 value_02 [16];
  undefined1 n_02 [16];
  undefined1 value_03 [16];
  type tVar1;
  int iVar2;
  int value_04;
  undefined4 in_register_00000014;
  digit_grouping<char> *in_R9;
  undefined8 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  uint local_424;
  char local_3f9;
  char local_3e9;
  anon_class_24_3_e2c60416 local_3c0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_3a8;
  uint local_3a0;
  undefined4 local_39c;
  uint size;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_390;
  buffer<char> *local_388;
  long local_380;
  appender local_370;
  buffer<char> *local_368;
  long local_360;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_350;
  buffer<char> *local_348;
  long local_340;
  appender local_330;
  buffer<char> *local_328;
  long local_320;
  undefined1 local_311;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bStack_310;
  bool upper_1;
  buffer<char> *local_308;
  long local_300;
  appender local_2f0;
  buffer<char> *local_2e8;
  long local_2e0;
  undefined1 local_2c9;
  undefined1 auStack_2c8 [7];
  bool upper;
  appender local_2c0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_2b8;
  long local_2b0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_2a0;
  buffer<char> *local_298;
  long local_290;
  allocator<char> local_271;
  undefined1 local_270 [8];
  memory_buffer buffer;
  int num_digits;
  digit_grouping<char> *grouping_local;
  format_specs<char> *specs_local;
  char cStack_38;
  uint prefix_local;
  unsigned___int128 value_local;
  long local_20;
  appender local_18;
  appender out_local;
  
  value_local._0_8_ = CONCAT44(in_register_00000014,prefix);
  specs_local._4_4_ = (uint)specs;
  buffer.alloc_ = (allocator<char>)0x0;
  buffer._533_3_ = 0;
  _cStack_38 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  value_local._8_8_ = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_20 = (long)value_local;
  local_18.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)this;
  std::allocator<char>::allocator();
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270,&local_271);
  std::allocator<char>::~allocator(&local_271);
  switch(grouping->field_0x8) {
  case 0:
  case 1:
    local_290 = (long)value_local;
    local_298 = _cStack_38;
    n._8_4_ = in_stack_fffffffffffffbd0;
    n._0_8_ = in_stack_fffffffffffffbc8;
    n._12_4_ = in_stack_fffffffffffffbd4;
    buffer._532_4_ = count_digits((detail *)_cStack_38,(uint128_opt)n);
    appender::back_insert_iterator((appender *)&local_2a0,(buffer<char> *)local_270);
    local_2b0 = (long)value_local;
    local_2b8.container = _cStack_38;
    value_00._8_4_ = in_stack_fffffffffffffbd0;
    value_00._0_8_ = in_stack_fffffffffffffbc8;
    value_00._12_4_ = in_stack_fffffffffffffbd4;
    _auStack_2c8 = format_decimal<char,_unsigned___int128,_fmt::v10::appender,_0>
                             ((detail *)local_2a0.container,(appender)_cStack_38,
                              (unsigned___int128)value_00,(int)(long)value_local);
    break;
  case 2:
    local_360 = (long)value_local;
    local_368 = _cStack_38;
    n_02._8_4_ = in_stack_fffffffffffffbd0;
    n_02._0_8_ = in_stack_fffffffffffffbc8;
    n_02._12_4_ = in_stack_fffffffffffffbd4;
    buffer._532_4_ = count_digits<3,unsigned__int128>((detail *)_cStack_38,(unsigned___int128)n_02);
    if ((((*(ushort *)&grouping->field_0x9 >> 7 & 1) != 0) &&
        (*(int *)&grouping->field_0x4 <= (int)buffer._532_4_)) &&
       (_cStack_38 != (buffer<char> *)0x0 || (long)value_local != 0)) {
      prefix_append((uint *)((long)&specs_local + 4),0x30);
    }
    appender::back_insert_iterator(&local_370,(buffer<char> *)local_270);
    local_380 = (long)value_local;
    local_388 = _cStack_38;
    value_03._8_4_ = in_stack_fffffffffffffbd0;
    value_03._0_8_ = in_stack_fffffffffffffbc8;
    value_03._12_4_ = in_stack_fffffffffffffbd4;
    local_390.container =
         (buffer<char> *)
         format_uint<3u,char,fmt::v10::appender,unsigned__int128>
                   (local_370,(unsigned___int128)value_03,(int)_cStack_38,SUB81((long)value_local,0)
                   );
    break;
  case 3:
  case 4:
    local_2c9 = grouping->field_0x8 == '\x04';
    if ((*(ushort *)&grouping->field_0x9 >> 7 & 1) != 0) {
      local_3e9 = 'X';
      if (!(bool)local_2c9) {
        local_3e9 = 'x';
      }
      prefix_append((uint *)((long)&specs_local + 4),(int)local_3e9 << 8 | 0x30);
    }
    local_2e0 = (long)value_local;
    local_2e8 = _cStack_38;
    n_00._8_4_ = in_stack_fffffffffffffbd0;
    n_00._0_8_ = in_stack_fffffffffffffbc8;
    n_00._12_4_ = in_stack_fffffffffffffbd4;
    buffer._532_4_ = count_digits<4,unsigned__int128>((detail *)_cStack_38,(unsigned___int128)n_00);
    appender::back_insert_iterator(&local_2f0,(buffer<char> *)local_270);
    local_300 = (long)value_local;
    local_308 = _cStack_38;
    value_01._8_4_ = in_stack_fffffffffffffbd0;
    value_01._0_8_ = in_stack_fffffffffffffbc8;
    value_01._12_4_ = in_stack_fffffffffffffbd4;
    bStack_310.container =
         (buffer<char> *)
         format_uint<4u,char,fmt::v10::appender,unsigned__int128>
                   (local_2f0,(unsigned___int128)value_01,(int)_cStack_38,SUB81((long)value_local,0)
                   );
    break;
  case 5:
  case 6:
    local_311 = grouping->field_0x8 == '\x06';
    if ((*(ushort *)&grouping->field_0x9 >> 7 & 1) != 0) {
      local_3f9 = 'B';
      if (!(bool)local_311) {
        local_3f9 = 'b';
      }
      prefix_append((uint *)((long)&specs_local + 4),(int)local_3f9 << 8 | 0x30);
    }
    local_320 = (long)value_local;
    local_328 = _cStack_38;
    n_01._8_4_ = in_stack_fffffffffffffbd0;
    n_01._0_8_ = in_stack_fffffffffffffbc8;
    n_01._12_4_ = in_stack_fffffffffffffbd4;
    buffer._532_4_ = count_digits<1,unsigned__int128>((detail *)_cStack_38,(unsigned___int128)n_01);
    appender::back_insert_iterator(&local_330,(buffer<char> *)local_270);
    local_340 = (long)value_local;
    local_348 = _cStack_38;
    value_02._8_4_ = in_stack_fffffffffffffbd0;
    value_02._0_8_ = in_stack_fffffffffffffbc8;
    value_02._12_4_ = in_stack_fffffffffffffbd4;
    local_350.container =
         (buffer<char> *)
         format_uint<1u,char,fmt::v10::appender,unsigned__int128>
                   (local_330,(unsigned___int128)value_02,(int)_cStack_38,SUB81((long)value_local,0)
                   );
    break;
  default:
    throw_format_error("invalid format specifier");
  case 0xf:
    _size = local_18.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
    out_local = write_char<char,fmt::v10::appender>
                          (local_18,cStack_38,(format_specs<char> *)grouping);
    goto LAB_00160f3e;
  }
  if (specs_local._4_4_ == 0) {
    local_424 = 0;
  }
  else {
    local_424 = specs_local._4_4_ >> 0x18;
  }
  tVar1 = to_unsigned<int>(buffer._532_4_);
  iVar2 = local_424 + tVar1;
  value_04 = digit_grouping<char>::count_separators(in_R9,buffer._532_4_);
  tVar1 = to_unsigned<int>(value_04);
  local_3a0 = iVar2 + tVar1;
  local_3a8 = local_18.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  local_3c0.prefix = (uint *)((long)&specs_local + 4);
  local_3c0.buffer = (memory_buffer *)local_270;
  out_local = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::write_int<fmt::v10::appender,unsigned__int128,char>(fmt::v10::appender,unsigned__int128,unsigned_int,fmt::v10::format_specs<char>const&,fmt::v10::detail::digit_grouping<char>const&)::_lambda(fmt::v10::appender)_1_>
                        (local_18,(format_specs<char> *)grouping,(ulong)local_3a0,(ulong)local_3a0,
                         &local_3c0);
LAB_00160f3e:
  local_39c = 1;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)local_270);
  return (appender)
         out_local.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_int(OutputIt out, UInt value, unsigned prefix,
               const format_specs<Char>& specs,
               const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = 0;
  auto buffer = memory_buffer();
  switch (specs.type) {
  case presentation_type::none:
  case presentation_type::dec: {
    num_digits = count_digits(value);
    format_decimal<char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::hex_lower:
  case presentation_type::hex_upper: {
    bool upper = specs.type == presentation_type::hex_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'X' : 'x') << 8 | '0');
    num_digits = count_digits<4>(value);
    format_uint<4, char>(appender(buffer), value, num_digits, upper);
    break;
  }
  case presentation_type::bin_lower:
  case presentation_type::bin_upper: {
    bool upper = specs.type == presentation_type::bin_upper;
    if (specs.alt)
      prefix_append(prefix, unsigned(upper ? 'B' : 'b') << 8 | '0');
    num_digits = count_digits<1>(value);
    format_uint<1, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::oct: {
    num_digits = count_digits<3>(value);
    // Octal prefix '0' is counted as a digit, so only add it if precision
    // is not greater than the number of digits.
    if (specs.alt && specs.precision <= num_digits && value != 0)
      prefix_append(prefix, '0');
    format_uint<3, char>(appender(buffer), value, num_digits);
    break;
  }
  case presentation_type::chr:
    return write_char(out, static_cast<Char>(value), specs);
  default:
    throw_format_error("invalid format specifier");
  }

  unsigned size = (prefix != 0 ? prefix >> 24 : 0) + to_unsigned(num_digits) +
                  to_unsigned(grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        for (unsigned p = prefix & 0xffffff; p != 0; p >>= 8)
          *it++ = static_cast<Char>(p & 0xff);
        return grouping.apply(it, string_view(buffer.data(), buffer.size()));
      });
}